

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

int ext_loader_impl_execution_path(loader_impl impl,char *path)

{
  path *this;
  undefined8 in_RDI;
  loader_impl_ext ext_impl;
  value_type *in_stack_ffffffffffffff98;
  set<std::filesystem::__cxx11::path,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  *in_stack_ffffffffffffffa0;
  format in_stack_ffffffffffffffd7;
  char **in_stack_ffffffffffffffd8;
  path *in_stack_ffffffffffffffe0;
  
  this = (path *)loader_impl_get(in_RDI);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  std::
  set<std::filesystem::__cxx11::path,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  ::insert(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::filesystem::__cxx11::path::~path(this);
  return 0;
}

Assistant:

int ext_loader_impl_execution_path(loader_impl impl, const loader_path path)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	ext_impl->paths.insert(fs::path(path));

	return 0;
}